

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::nonfinite_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          nonfinite_writer<wchar_t> *f)

{
  undefined8 *puVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  fill_t<wchar_t> *fill;
  size_t n;
  int *piVar7;
  
  uVar6 = 4 - (ulong)(f->sign == none);
  n = (uint)specs->width - uVar6;
  if ((uint)specs->width < uVar6 || n == 0) {
    puVar1 = *(undefined8 **)this;
    lVar4 = puVar1[2];
    uVar6 = uVar6 + lVar4;
    if ((ulong)puVar1[3] < uVar6) {
      (**(code **)*puVar1)(puVar1,uVar6);
    }
    puVar1[2] = uVar6;
    piVar7 = (int *)(lVar4 * 4 + puVar1[1]);
    if ((ulong)f->sign != 0) {
      *piVar7 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      piVar7 = piVar7 + 1;
    }
    pcVar3 = f->str;
    uVar6 = 4;
    lVar4 = 0;
    do {
      piVar7[lVar4] = (int)pcVar3[lVar4];
      uVar6 = uVar6 - 1;
      lVar4 = lVar4 + 1;
    } while (1 < uVar6);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar4 = puVar1[2];
  uVar6 = uVar6 + lVar4 + (specs->fill).size_ * n;
  if ((ulong)puVar1[3] < uVar6) {
    (**(code **)*puVar1)(puVar1,uVar6);
  }
  puVar1[2] = uVar6;
  pwVar5 = (wchar_t *)(lVar4 * 4 + puVar1[1]);
  fill = &specs->fill;
  bVar2 = specs->field_0x9 & 0xf;
  if (bVar2 == 3) {
    pwVar5 = fill<wchar_t*,wchar_t>(pwVar5,n >> 1,fill);
    if ((ulong)f->sign != 0) {
      *pwVar5 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pwVar5 = pwVar5 + 1;
    }
    pcVar3 = f->str;
    uVar6 = 4;
    do {
      *pwVar5 = (int)*pcVar3;
      pcVar3 = pcVar3 + 1;
      pwVar5 = pwVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
    n = n - (n >> 1);
  }
  else {
    if (bVar2 == 2) {
      pwVar5 = fill<wchar_t*,wchar_t>(pwVar5,n,fill);
      if ((ulong)f->sign != 0) {
        *pwVar5 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        pwVar5 = pwVar5 + 1;
      }
      pcVar3 = f->str;
      uVar6 = 4;
      lVar4 = 0;
      do {
        pwVar5[lVar4] = (int)pcVar3[lVar4];
        uVar6 = uVar6 - 1;
        lVar4 = lVar4 + 1;
      } while (1 < uVar6);
      return;
    }
    if ((ulong)f->sign != 0) {
      *pwVar5 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pwVar5 = pwVar5 + 1;
    }
    pcVar3 = f->str;
    uVar6 = 4;
    do {
      *pwVar5 = (int)*pcVar3;
      pcVar3 = pcVar3 + 1;
      pwVar5 = pwVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  fill<wchar_t*,wchar_t>(pwVar5,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }